

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Range.hpp
# Opt level: O0

int __thiscall binlog::Range::read<int>(Range *this)

{
  int iVar1;
  long *in_RDI;
  int dst;
  size_t in_stack_000000b8;
  Range *in_stack_000000c0;
  
  throw_if_overflow(in_stack_000000c0,in_stack_000000b8);
  iVar1 = *(int *)*in_RDI;
  *in_RDI = *in_RDI + 4;
  return iVar1;
}

Assistant:

T read()
  {
    static_assert(std::is_trivially_copyable<T>::value, "T must be trivially copyable");

    throw_if_overflow(sizeof(T));

    T dst;
    memcpy(&dst, _begin, sizeof(T));
    _begin += sizeof(T);

    return dst;
  }